

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Algorithm_Base.cpp
# Opt level: O3

void __thiscall OSTEI_HRR_Algorithm_Base::Create(OSTEI_HRR_Algorithm_Base *this,QAM *am)

{
  pointer pcVar1;
  initializer_list<QAM> __l;
  allocator_type local_7a;
  less<QAM> local_79;
  undefined1 local_78 [16];
  _Alloc_hider local_68;
  char local_58 [24];
  _Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_> local_40;
  
  local_78._0_4_ = (am->qam)._M_elems[0];
  local_78._4_4_ = (am->qam)._M_elems[1];
  local_78._8_4_ = (am->qam)._M_elems[2];
  local_78._12_4_ = (am->qam)._M_elems[3];
  pcVar1 = (am->tag)._M_dataplus._M_p;
  local_68._M_p = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + (am->tag)._M_string_length);
  __l._M_len = 1;
  __l._M_array = (iterator)local_78;
  std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::set
            ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)&local_40,__l,&local_79,&local_7a);
  Create(this,(set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)&local_40);
  std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::~_Rb_tree
            (&local_40);
  if (local_68._M_p != local_58) {
    operator_delete(local_68._M_p);
  }
  return;
}

Assistant:

void OSTEI_HRR_Algorithm_Base::Create(QAM am)
{
    Create(std::set<QAM>{am});
}